

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# htmlparser_cpp_test.cc
# Opt level: O3

void __thiscall
ctemplate_htmlparser::HtmlparserCppTest::ValidateJavascriptState
          (HtmlparserCppTest *this,string *expected_state)

{
  HtmlParser *source;
  _Rb_tree_header *p_Var1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *str;
  size_t __n;
  int iVar2;
  HtmlparserCppTest *pHVar3;
  char *extraout_RAX;
  char *extraout_RAX_00;
  char *extraout_RAX_01;
  int *piVar4;
  long lVar5;
  HtmlParser *this_00;
  const_iterator cVar6;
  mapped_type *ppHVar7;
  undefined8 extraout_RAX_02;
  HtmlparserCppTest *pHVar8;
  undefined1 *puVar9;
  HtmlparserCppTest *pHVar10;
  HtmlparserCppTest *pHVar11;
  HtmlparserCppTest *pHVar12;
  pointer this_01;
  _Base_ptr unaff_R12;
  HtmlparserCppTest *unaff_R14;
  pointer str_00;
  _Base_ptr unaff_R15;
  bool bVar13;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vStack_128;
  HtmlparserCppTest *pHStack_110;
  _Base_ptr p_Stack_108;
  undefined1 auStack_c8 [16];
  _Base_ptr p_Stack_b8;
  HtmlparserCppTest *pHStack_b0;
  _Base_ptr p_Stack_a8;
  undefined1 auStack_a0 [16];
  _Base_ptr p_Stack_90;
  HtmlparserCppTest *pHStack_88;
  _Base_ptr p_Stack_80;
  char *pcStack_78;
  HtmlParser HStack_70;
  allocator local_31;
  HtmlparserCppTest *local_30;
  size_t local_28;
  
  pHVar8 = (HtmlparserCppTest *)(this->parser_).parser_;
  iVar2 = ctemplate_htmlparser::htmlparser_js_state((htmlparser_ctx_s *)pHVar8);
  puVar9 = kJavascriptStateMap;
  pHVar3 = (HtmlparserCppTest *)IdToName(pHVar8,(IdNameMap *)kJavascriptStateMap,iVar2);
  if (expected_state->_M_string_length == 0) {
    ValidateJavascriptState();
  }
  else {
    pHVar8 = (HtmlparserCppTest *)&local_30;
    std::__cxx11::string::string((string *)pHVar8,(char *)pHVar3,&local_31);
    __n = expected_state->_M_string_length;
    puVar9 = (undefined1 *)pHVar3;
    if (__n == local_28) {
      if (__n == 0) {
        bVar13 = true;
      }
      else {
        pHVar8 = (HtmlparserCppTest *)(expected_state->_M_dataplus)._M_p;
        puVar9 = (undefined1 *)local_30;
        iVar2 = bcmp(pHVar8,local_30,__n);
        bVar13 = iVar2 == 0;
      }
    }
    else {
      bVar13 = false;
    }
    if (local_30 != (HtmlparserCppTest *)&stack0xffffffffffffffe0) {
      pHVar8 = local_30;
      operator_delete(local_30);
    }
    unaff_R14 = local_30;
    if (bVar13) {
      return;
    }
  }
  ValidateJavascriptState();
  bVar13 = StringToBool((string *)puVar9);
  pHVar3 = (HtmlparserCppTest *)(pHVar8->parser_).parser_;
  iVar2 = ctemplate_htmlparser::htmlparser_in_css((htmlparser_ctx_s *)pHVar3);
  if (bVar13 == (iVar2 != 0)) {
    return;
  }
  ValidateInCss();
  pHVar10 = (HtmlparserCppTest *)&pcStack_78;
  pHVar12 = pHVar3;
  HStack_70.parser_ = (htmlparser_ctx *)pHVar8;
  if (*(long *)&(((HtmlparserCppTest *)puVar9)->contextMap)._M_t._M_impl.super__Rb_tree_header.
                _M_header == 0) {
LAB_00107324:
    pHVar10 = (HtmlparserCppTest *)puVar9;
    p_Stack_80 = (_Base_ptr)0x107329;
    ValidateLine();
  }
  else {
    p_Stack_80 = (_Base_ptr)0x1072dc;
    pcStack_78 = extraout_RAX;
    unaff_R15 = (_Base_ptr)__errno_location();
    unaff_R15->_M_color = _S_red;
    pHVar12 = *(HtmlparserCppTest **)&(((HtmlparserCppTest *)puVar9)->contextMap)._M_t._M_impl;
    p_Stack_80 = (_Base_ptr)0x1072f8;
    unaff_R14 = (HtmlparserCppTest *)strtol((char *)pHVar12,&pcStack_78,10);
    pHVar8 = pHVar3;
    puVar9 = (undefined1 *)pHVar10;
    unaff_R12 = (_Base_ptr)&pcStack_78;
    if ((*pcStack_78 != '\0') || (unaff_R12 = (_Base_ptr)&pcStack_78, unaff_R15->_M_color != _S_red)
       ) goto LAB_00107324;
    pHVar12 = (HtmlparserCppTest *)(pHVar3->parser_).parser_;
    p_Stack_80 = (_Base_ptr)0x107313;
    iVar2 = ctemplate_htmlparser::htmlparser_get_line_number((htmlparser_ctx_s *)pHVar12);
    unaff_R12 = (_Base_ptr)&pcStack_78;
    if (iVar2 == (int)unaff_R14) {
      return;
    }
  }
  p_Stack_80 = (_Base_ptr)ValidateColumn;
  ValidateLine();
  p_Stack_80 = unaff_R15;
  pHStack_88 = unaff_R14;
  p_Stack_90 = unaff_R12;
  auStack_a0._8_8_ = pHVar8;
  pHVar11 = (HtmlparserCppTest *)auStack_a0;
  auStack_a0._0_8_ = extraout_RAX_00;
  pHVar3 = pHVar12;
  if (*(long *)&(pHVar10->contextMap)._M_t._M_impl.super__Rb_tree_header._M_header == 0) {
LAB_00107390:
    pHVar11 = pHVar10;
    p_Stack_a8 = (_Base_ptr)0x107395;
    ValidateColumn();
  }
  else {
    p_Stack_a8 = (_Base_ptr)0x107348;
    unaff_R15 = (_Base_ptr)__errno_location();
    unaff_R15->_M_color = _S_red;
    pHVar3 = *(HtmlparserCppTest **)&(pHVar10->contextMap)._M_t._M_impl;
    p_Stack_a8 = (_Base_ptr)0x107364;
    unaff_R14 = (HtmlparserCppTest *)strtol((char *)pHVar3,(char **)auStack_a0,10);
    pHVar8 = pHVar12;
    pHVar10 = pHVar11;
    unaff_R12 = (_Base_ptr)auStack_a0;
    if ((*(char *)auStack_a0._0_8_ != '\0') ||
       (unaff_R12 = (_Base_ptr)auStack_a0, unaff_R15->_M_color != _S_red)) goto LAB_00107390;
    pHVar3 = (HtmlparserCppTest *)(pHVar12->parser_).parser_;
    p_Stack_a8 = (_Base_ptr)0x10737f;
    iVar2 = ctemplate_htmlparser::htmlparser_get_column_number((htmlparser_ctx_s *)pHVar3);
    unaff_R12 = (_Base_ptr)auStack_a0;
    if (iVar2 == (int)unaff_R14) {
      return;
    }
  }
  p_Stack_a8 = (_Base_ptr)ValidateValueIndex;
  ValidateColumn();
  p_Stack_a8 = unaff_R15;
  pHStack_b0 = unaff_R14;
  p_Stack_b8 = unaff_R12;
  auStack_c8._8_8_ = pHVar8;
  pHVar12 = (HtmlparserCppTest *)auStack_c8;
  auStack_c8._0_8_ = extraout_RAX_01;
  pHVar8 = pHVar3;
  if (*(long *)&(pHVar11->contextMap)._M_t._M_impl.super__Rb_tree_header._M_header != 0) {
    piVar4 = __errno_location();
    *piVar4 = 0;
    pHVar8 = *(HtmlparserCppTest **)&(pHVar11->contextMap)._M_t._M_impl;
    lVar5 = strtol((char *)pHVar8,(char **)auStack_c8,10);
    pHVar11 = pHVar12;
    unaff_R12 = (_Base_ptr)auStack_c8;
    if ((*(char *)auStack_c8._0_8_ == '\0') && (unaff_R12 = (_Base_ptr)auStack_c8, *piVar4 == 0)) {
      pHVar8 = (HtmlparserCppTest *)(pHVar3->parser_).parser_;
      iVar2 = ctemplate_htmlparser::htmlparser_value_index((htmlparser_ctx_s *)pHVar8);
      unaff_R12 = (_Base_ptr)auStack_c8;
      if (iVar2 == (int)lVar5) {
        return;
      }
      goto LAB_00107401;
    }
  }
  pHVar12 = pHVar11;
  ValidateValueIndex();
LAB_00107401:
  ValidateValueIndex();
  bVar13 = StringToBool((string *)pHVar12);
  pHVar3 = (HtmlparserCppTest *)(pHVar8->parser_).parser_;
  iVar2 = ctemplate_htmlparser::htmlparser_is_url_start((htmlparser_ctx_s *)pHVar3);
  if (bVar13 == (iVar2 != 0)) {
    return;
  }
  ValidateIsUrlStart();
  vStack_128.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vStack_128.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_128.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pHStack_110 = pHVar8;
  p_Stack_108 = unaff_R12;
  SplitStringIntoKeyValuePairs((string *)pHVar12,"=",",",&vStack_128);
  if (vStack_128.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      vStack_128.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    source = &pHVar3->parser_;
    p_Var1 = &(pHVar3->contextMap)._M_t._M_impl.super__Rb_tree_header;
    str_00 = vStack_128.
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      StripWhiteSpace(&str_00->first);
      str = &str_00->second;
      StripWhiteSpace(str);
      iVar2 = std::__cxx11::string::compare((char *)str_00);
      if (iVar2 == 0) {
        ValidateState(pHVar3,str);
      }
      else {
        iVar2 = std::__cxx11::string::compare((char *)str_00);
        if (iVar2 == 0) {
          ValidateTag(pHVar3,str);
        }
        else {
          iVar2 = std::__cxx11::string::compare((char *)str_00);
          if (iVar2 == 0) {
            ValidateAttribute(pHVar3,str);
          }
          else {
            iVar2 = std::__cxx11::string::compare((char *)str_00);
            if (iVar2 == 0) {
              ValidateValue(pHVar3,str);
            }
            else {
              iVar2 = std::__cxx11::string::compare((char *)str_00);
              if (iVar2 == 0) {
                ValidateAttributeType(pHVar3,str);
              }
              else {
                iVar2 = std::__cxx11::string::compare((char *)str_00);
                if (iVar2 == 0) {
                  ValidateAttributeQuoted(pHVar3,str);
                }
                else {
                  iVar2 = std::__cxx11::string::compare((char *)str_00);
                  if (iVar2 == 0) {
                    ValidateInJavascript(pHVar3,str);
                  }
                  else {
                    iVar2 = std::__cxx11::string::compare((char *)str_00);
                    if (iVar2 == 0) {
                      ValidateJavascriptQuoted(pHVar3,str);
                    }
                    else {
                      iVar2 = std::__cxx11::string::compare((char *)str_00);
                      if (iVar2 == 0) {
                        ValidateJavascriptState(pHVar3,str);
                      }
                      else {
                        iVar2 = std::__cxx11::string::compare((char *)str_00);
                        if (iVar2 == 0) {
                          ValidateInCss(pHVar3,str);
                        }
                        else {
                          iVar2 = std::__cxx11::string::compare((char *)str_00);
                          if (iVar2 == 0) {
                            ValidateLine(pHVar3,str);
                          }
                          else {
                            iVar2 = std::__cxx11::string::compare((char *)str_00);
                            if (iVar2 == 0) {
                              ValidateColumn(pHVar3,str);
                            }
                            else {
                              iVar2 = std::__cxx11::string::compare((char *)str_00);
                              if (iVar2 == 0) {
                                ValidateValueIndex(pHVar3,str);
                              }
                              else {
                                iVar2 = std::__cxx11::string::compare((char *)str_00);
                                if (iVar2 == 0) {
                                  ValidateIsUrlStart(pHVar3,str);
                                }
                                else {
                                  iVar2 = std::__cxx11::string::compare((char *)str_00);
                                  if (iVar2 == 0) {
                                    cVar6 = std::
                                            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>_>
                                            ::find((
                                                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>_>
                                                  *)pHVar3,str);
                                    if ((_Rb_tree_header *)cVar6._M_node == p_Var1) {
                                      this_00 = (HtmlParser *)operator_new(8);
                                      HtmlParser::HtmlParser(this_00);
                                      ppHVar7 = std::
                                                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>_>
                                                ::operator[](&pHVar3->contextMap,str);
                                      *ppHVar7 = this_00;
                                    }
                                    ppHVar7 = std::
                                              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>_>
                                              ::operator[](&pHVar3->contextMap,str);
                                    HtmlParser::CopyFrom(*ppHVar7,source);
                                  }
                                  else {
                                    iVar2 = std::__cxx11::string::compare((char *)str_00);
                                    if (iVar2 == 0) {
                                      cVar6 = std::
                                              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>_>
                                              ::find((
                                                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>_>
                                                  *)pHVar3,str);
                                      if ((_Rb_tree_header *)cVar6._M_node == p_Var1) {
                                        ProcessAnnotation();
LAB_00107851:
                                        ProcessAnnotation();
                                        std::
                                        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                        ::~vector(&vStack_128);
                                        _Unwind_Resume(extraout_RAX_02);
                                      }
                                      ppHVar7 = std::
                                                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>_>
                                                ::operator[](&pHVar3->contextMap,str);
                                      HtmlParser::CopyFrom(source,*ppHVar7);
                                    }
                                    else {
                                      iVar2 = std::__cxx11::string::compare((char *)str_00);
                                      if (iVar2 == 0) {
                                        bVar13 = StringToBool(str);
                                        if (bVar13) {
                                          ctemplate_htmlparser::htmlparser_reset(source->parser_);
                                        }
                                      }
                                      else {
                                        this_01 = str_00;
                                        iVar2 = std::__cxx11::string::compare((char *)str_00);
                                        if (iVar2 == 0) {
                                          iVar2 = NameToId((HtmlparserCppTest *)this_01,
                                                           (IdNameMap *)kResetModeMap,str);
                                          ctemplate_htmlparser::htmlparser_reset_mode
                                                    (source->parser_,iVar2);
                                        }
                                        else {
                                          iVar2 = std::__cxx11::string::compare((char *)str_00);
                                          if (iVar2 != 0) goto LAB_00107851;
                                          bVar13 = StringToBool(str);
                                          if (bVar13) {
                                            ctemplate_htmlparser::htmlparser_insert_text
                                                      (source->parser_);
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      str_00 = str_00 + 1;
    } while (str_00 != vStack_128.
                       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&vStack_128);
  return;
}

Assistant:

void HtmlparserCppTest::ValidateJavascriptState(const string &expected_state) {
  const char* parsed_state = IdToName(kJavascriptStateMap,
                                      parser_.javascript_state());
  EXPECT_TRUE(parsed_state != NULL);
  EXPECT_TRUE(!expected_state.empty());
  EXPECT_EQ(expected_state, string(parsed_state))
      << "Unexpected javascript state at line " << parser_.line_number();
}